

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicksort.c
# Opt level: O3

void quicksort(string *a,size_t n)

{
  undefined1 auVar1 [16];
  uchar *s2;
  string puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  string *ppuVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  
  if (9 < n) {
LAB_001de19d:
    iVar4 = (int)(n >> 1);
    iVar8 = (int)n;
    uVar16 = iVar8 - 1;
    if (n < 0x29) {
      iVar3 = 0;
      uVar5 = uVar16;
    }
    else {
      iVar6 = (int)(n >> 3);
      iVar3 = med3(0,iVar6,iVar6 * 2,a);
      iVar4 = med3(iVar4 - iVar6,iVar4,iVar4 + iVar6,a);
      uVar5 = med3(uVar16 + iVar6 * -2,uVar16 - iVar6,uVar16,a);
    }
    iVar4 = med3(iVar3,iVar4,uVar5,a);
    s2 = a[iVar4];
    iVar4 = 0;
    uVar9 = 0;
    uVar5 = uVar16;
    do {
      lVar12 = (long)(int)uVar16;
      iVar3 = iVar4;
      if (iVar4 <= (int)uVar16) {
        lVar17 = (long)iVar4 + -1;
        do {
          iVar6 = scmp(a[lVar17 + 1],s2);
          iVar3 = iVar4;
          if (0 < iVar6) break;
          if (iVar6 == 0) {
            puVar2 = a[(int)uVar9];
            a[(int)uVar9] = a[lVar17 + 1];
            a[lVar17 + 1] = puVar2;
            uVar9 = uVar9 + 1;
          }
          iVar4 = iVar4 + 1;
          lVar17 = lVar17 + 1;
          iVar3 = uVar16 + 1;
        } while (lVar17 < lVar12);
      }
      lVar17 = (long)iVar3;
      if ((int)uVar16 < iVar3) goto LAB_001de30e;
      lVar13 = lVar12 << 0x20;
      lVar12 = lVar12 + 1;
      while( true ) {
        iVar4 = scmp(a[lVar12 + -1],s2);
        if (iVar4 < 0) break;
        if (iVar4 == 0) {
          puVar2 = a[lVar12 + -1];
          a[lVar12 + -1] = a[(int)uVar5];
          a[(int)uVar5] = puVar2;
          uVar5 = uVar5 - 1;
        }
        lVar13 = lVar13 + -0x100000000;
        uVar16 = uVar16 - 1;
        lVar12 = lVar12 + -1;
        if (lVar12 <= lVar17) goto LAB_001de30e;
      }
      puVar2 = a[lVar17];
      a[lVar17] = *(string *)((long)a + (lVar13 >> 0x1d));
      *(string *)((long)a + (lVar13 >> 0x1d)) = puVar2;
      iVar4 = iVar3 + 1;
      uVar16 = uVar16 - 1;
    } while( true );
  }
  if (1 < n) {
LAB_001de3e9:
    sVar15 = 1;
    lVar17 = 2;
    lVar12 = lVar17;
LAB_001de3f8:
    do {
      iVar8 = scmp(a[lVar17 + -2],a[lVar17 + -1]);
      if (0 < iVar8) {
        auVar1 = *(undefined1 (*) [16])(a + lVar17 + -2);
        auVar18._0_8_ = auVar1._8_8_;
        auVar18._8_4_ = auVar1._0_4_;
        auVar18._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(a + lVar17 + -2) = auVar18;
        lVar17 = lVar17 + -1;
        if (1 < lVar17) goto LAB_001de3f8;
      }
      sVar15 = sVar15 + 1;
      lVar17 = lVar12 + 1;
      lVar12 = lVar17;
    } while (sVar15 != n);
  }
  return;
LAB_001de30e:
  uVar14 = iVar3 - uVar9;
  uVar7 = uVar14;
  if ((int)uVar9 < (int)uVar14) {
    uVar7 = uVar9;
  }
  if (0 < (int)uVar7) {
    lVar12 = (long)(int)uVar14;
    if ((long)(int)uVar9 < (long)(int)uVar14) {
      lVar12 = (long)(int)uVar9;
    }
    uVar10 = 0;
    do {
      puVar2 = a[uVar10];
      a[uVar10] = a[(lVar17 + uVar10) - lVar12];
      a[(lVar17 + uVar10) - lVar12] = puVar2;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  uVar16 = uVar5 - uVar16;
  uVar9 = ~uVar5 + iVar8;
  uVar5 = uVar9;
  if ((int)uVar16 < (int)uVar9) {
    uVar5 = uVar16;
  }
  if (0 < (int)uVar5) {
    lVar12 = (long)(int)uVar16;
    if ((long)(int)uVar9 < (long)(int)uVar16) {
      lVar12 = (long)(int)uVar9;
    }
    uVar5 = uVar5 + 1;
    ppuVar11 = a;
    do {
      puVar2 = ppuVar11[lVar17];
      ppuVar11[lVar17] = ppuVar11[iVar8 - lVar12];
      ppuVar11[iVar8 - lVar12] = puVar2;
      ppuVar11 = ppuVar11 + 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  if (1 < (int)uVar14) {
    quicksort(a,(ulong)uVar14);
  }
  if ((int)uVar16 < 2) {
    return;
  }
  a = a + (int)(iVar8 - uVar16);
  n = (size_t)uVar16;
  if (uVar16 < 10) goto LAB_001de3e9;
  goto LAB_001de19d;
}

Assistant:

void quicksort(string a[], size_t n)
{
   int pa, pb, pc, pd, pl, pm, pn, r, s;
   string t;
   string pv;

   if (n < 10) {       /* Insertion sort on smallest arrays */
      for (pm = 1; pm < n; pm++)
         for (pl = pm; pl > 0 && scmp(a[pl-1], a[pl]) > 0; pl--)
            swap(a[pl], a[pl-1]);
      return;
   }
   pm = n/2;               /* Small arrays, middle element */
   if (n > 7) {
      pl = 0;
      pn = n-1;
      if (n > 40) {       /* Big arrays, pseudomedian of 9 */
         s = n/8;
         pl = med3(pl, pl+s, pl+2*s, a);
         pm = med3(pm-s, pm, pm+s, a);
         pn = med3(pn-2*s, pn-s, pn, a);
      }
      pm = med3(pl, pm, pn, a);      /* Mid-size, med of 3 */
   }
   pv = a[pm];
   pa = pb = 0;
   pc = pd = n-1;
   for (;;) {
      while (pb <= pc && (r = scmp(a[pb], pv)) <= 0) {
         if (r == 0) { swap(a[pa], a[pb]); pa++; }
         pb++;
      }
      while (pc >= pb && (r = scmp(a[pc], pv)) >= 0) {
         if (r == 0) { swap(a[pc], a[pd]); pd--; }
         pc--;
      }
      if (pb > pc) break;
      swap(a[pb], a[pc]);
      pb++;
      pc--;
   }
   pn = n;
   s = min(pa,  pb-pa   ); vecswap(0,  pb-s, s, a);
   s = min(pd-pc, pn-pd-1); vecswap(pb, pn-s, s, a);
   if ((s = pb-pa) > 1) quicksort(a,    s);
   if ((s = pd-pc) > 1) quicksort(&a[pn-s], s);
}